

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeavyRowGenerator.cpp
# Opt level: O0

bool __thiscall OffsetCauchyMatrixParams::Initialize(OffsetCauchyMatrixParams *this,uint64_t seed)

{
  uint32_t uVar1;
  uint *in_RDI;
  PCGRandom prng;
  uint64_t in_stack_ffffffffffffffd8;
  PCGRandom *in_stack_ffffffffffffffe0;
  bool local_1;
  
  siamese::PCGRandom::PCGRandom((PCGRandom *)&stack0xffffffffffffffd8);
  siamese::PCGRandom::Seed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(uint64_t)in_RDI);
  uVar1 = siamese::PCGRandom::Next((PCGRandom *)&stack0xffffffffffffffd8);
  *in_RDI = (uVar1 & 0xff) + 1;
  if (*in_RDI < 6) {
    local_1 = false;
  }
  else {
    in_RDI[1] = 0x100 - *in_RDI;
    if (in_RDI[1] < 0x12) {
      local_1 = false;
    }
    else {
      in_RDI[2] = *in_RDI - 6;
      in_RDI[3] = in_RDI[1] - 0x12;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Initialize(const uint64_t seed)
    {
        PCGRandom prng;
        prng.Seed(seed);

        Rows = (prng.Next() % 256) + 1;
        if (Rows < kRows) {
            return false;
        }
        Cols = 256 - Rows;
        if (Cols < kColumns) {
            return false;
        }

        RowWiggle = Rows - kRows;
        ColWiggle = Cols - kColumns;
        // We could add a random offset here too but not needed to find a solution.
        return true;
    }